

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupportTest_tracingWorksHierarchically_TestShell::
TEST_MockSupportTest_tracingWorksHierarchically_TestShell
          (TEST_MockSupportTest_tracingWorksHierarchically_TestShell *this)

{
  TEST_MockSupportTest_tracingWorksHierarchically_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)&PTR__TEST_MockSupportTest_tracingWorksHierarchically_TestShell_003658c8;
  return;
}

Assistant:

TEST(MockSupportTest, tracingWorksHierarchically)
{
    mock("scope").tracing(true);
    mock().tracing(true);

    mock().actualCall("boo");
    mock("scope").actualCall("foo");
    mock().checkExpectations();

    STRCMP_CONTAINS("boo", mock().getTraceOutput());
    STRCMP_CONTAINS("foo", mock().getTraceOutput());
}